

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_unarrow_sat16_aarch64(CPUARMState_conflict *env,uint64_t x)

{
  uint local_20;
  int local_1c;
  uint32_t low;
  uint32_t high;
  uint64_t x_local;
  CPUARMState_conflict *env_local;
  
  local_20 = (uint)x;
  if ((x & 0x80000000) == 0) {
    if (0xffff < local_20) {
      local_20 = 0xffff;
      (env->vfp).qc[0] = 1;
    }
  }
  else {
    local_20 = 0;
    (env->vfp).qc[0] = 1;
  }
  local_1c = (int)(x >> 0x20);
  if ((x & 0x8000000000000000) == 0) {
    if (0xffffffffffff < x) {
      local_1c = 0xffff;
      (env->vfp).qc[0] = 1;
    }
  }
  else {
    local_1c = 0;
    (env->vfp).qc[0] = 1;
  }
  return local_20 | local_1c << 0x10;
}

Assistant:

uint32_t HELPER(neon_unarrow_sat16)(CPUARMState *env, uint64_t x)
{
    uint32_t high;
    uint32_t low;
    low = x;
    if (low & 0x80000000) {
        low = 0;
        SET_QC();
    } else if (low > 0xffff) {
        low = 0xffff;
        SET_QC();
    }
    high = x >> 32;
    if (high & 0x80000000) {
        high = 0;
        SET_QC();
    } else if (high > 0xffff) {
        high = 0xffff;
        SET_QC();
    }
    return low | (high << 16);
}